

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Analyze(Parse *pParse,Token *pName1,Token *pName2)

{
  int iVar1;
  Vdbe *p;
  Vdbe *v;
  Token *pTableName;
  Index *pIdx;
  Table *pTab;
  char *zDb;
  char *z;
  int i;
  int iDb;
  sqlite3 *db;
  Token *pName2_local;
  Token *pName1_local;
  Parse *pParse_local;
  
  _i = pParse->db;
  db = (sqlite3 *)pName2;
  pName2_local = pName1;
  pName1_local = (Token *)pParse;
  iVar1 = sqlite3ReadSchema(pParse);
  if (iVar1 == 0) {
    if (pName2_local == (Token *)0x0) {
      for (z._0_4_ = 0; (int)z < _i->nDb; z._0_4_ = (int)z + 1) {
        if ((int)z != 1) {
          analyzeDatabase((Parse *)pName1_local,(int)z);
        }
      }
    }
    else if (*(int *)&db->pVdbe == 0) {
      z._4_4_ = sqlite3FindDb(_i,pName2_local);
      if (z._4_4_ < 0) {
        zDb = sqlite3NameFromToken(_i,pName2_local);
        if (zDb != (char *)0x0) {
          pTableName = (Token *)sqlite3FindIndex(_i,zDb,(char *)0x0);
          if ((Index *)pTableName == (Index *)0x0) {
            pIdx = (Index *)sqlite3LocateTable((Parse *)pName1_local,0,zDb,(char *)0x0);
            if ((Table *)pIdx != (Table *)0x0) {
              analyzeTable((Parse *)pName1_local,(Table *)pIdx,(Index *)0x0);
            }
          }
          else {
            analyzeTable((Parse *)pName1_local,((Index *)pTableName)->pTable,(Index *)pTableName);
          }
          sqlite3DbFree(_i,zDb);
        }
      }
      else {
        analyzeDatabase((Parse *)pName1_local,z._4_4_);
      }
    }
    else {
      z._4_4_ = sqlite3TwoPartName((Parse *)pName1_local,pName2_local,(Token *)db,(Token **)&v);
      if (-1 < z._4_4_) {
        pTab = (Table *)_i->aDb[z._4_4_].zDbSName;
        zDb = sqlite3NameFromToken(_i,(Token *)v);
        if (zDb != (char *)0x0) {
          pTableName = (Token *)sqlite3FindIndex(_i,zDb,(char *)pTab);
          if ((Index *)pTableName == (Index *)0x0) {
            pIdx = (Index *)sqlite3LocateTable((Parse *)pName1_local,0,zDb,(char *)pTab);
            if ((Table *)pIdx != (Table *)0x0) {
              analyzeTable((Parse *)pName1_local,(Table *)pIdx,(Index *)0x0);
            }
          }
          else {
            analyzeTable((Parse *)pName1_local,((Index *)pTableName)->pTable,(Index *)pTableName);
          }
          sqlite3DbFree(_i,zDb);
        }
      }
    }
    p = sqlite3GetVdbe((Parse *)pName1_local);
    if (p != (Vdbe *)0x0) {
      sqlite3VdbeAddOp0(p,0x95);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Analyze(Parse *pParse, Token *pName1, Token *pName2){
  sqlite3 *db = pParse->db;
  int iDb;
  int i;
  char *z, *zDb;
  Table *pTab;
  Index *pIdx;
  Token *pTableName;
  Vdbe *v;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  assert( pName2!=0 || pName1==0 );
  if( pName1==0 ){
    /* Form 1:  Analyze everything */
    for(i=0; i<db->nDb; i++){
      if( i==1 ) continue;  /* Do not analyze the TEMP database */
      analyzeDatabase(pParse, i);
    }
  }else if( pName2->n==0 ){
    /* Form 2:  Analyze the database or table named */
    iDb = sqlite3FindDb(db, pName1);
    if( iDb>=0 ){
      analyzeDatabase(pParse, iDb);
    }else{
      z = sqlite3NameFromToken(db, pName1);
      if( z ){
        if( (pIdx = sqlite3FindIndex(db, z, 0))!=0 ){
          analyzeTable(pParse, pIdx->pTable, pIdx);
        }else if( (pTab = sqlite3LocateTable(pParse, 0, z, 0))!=0 ){
          analyzeTable(pParse, pTab, 0);
        }
        sqlite3DbFree(db, z);
      }
    }
  }else{
    /* Form 3: Analyze the fully qualified table name */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pTableName);
    if( iDb>=0 ){
      zDb = db->aDb[iDb].zDbSName;
      z = sqlite3NameFromToken(db, pTableName);
      if( z ){
        if( (pIdx = sqlite3FindIndex(db, z, zDb))!=0 ){
          analyzeTable(pParse, pIdx->pTable, pIdx);
        }else if( (pTab = sqlite3LocateTable(pParse, 0, z, zDb))!=0 ){
          analyzeTable(pParse, pTab, 0);
        }
        sqlite3DbFree(db, z);
      }
    }   
  }
  v = sqlite3GetVdbe(pParse);
  if( v ) sqlite3VdbeAddOp0(v, OP_Expire);
}